

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hh
# Opt level: O2

void __thiscall
kratos::InterfaceDefinition::InterfaceDefinition(InterfaceDefinition *this,string *name)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_enable_shared_from_this<kratos::InterfaceDefinition>)._M_weak_this.
  super___weak_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<kratos::InterfaceDefinition>)._M_weak_this.
  super___weak_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_IDefinition)._vptr_IDefinition = (_func_int **)&PTR_has_port_0057e4c8;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  p_Var1 = &(this->ports_)._M_t._M_impl.super__Rb_tree_header;
  (this->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ports_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->vars_)._M_t._M_impl.super__Rb_tree_header;
  (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mod_ports_)._M_t._M_impl.super__Rb_tree_header;
  (this->mod_ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mod_ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mod_ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mod_ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mod_ports_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

explicit InterfaceDefinition(std::string name) : name_(std::move(name)) {}